

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O1

_Bool plutosvg_document_render
                (plutosvg_document_t *document,char *id,plutovg_canvas_t *canvas,
                plutovg_color_t *current_color,plutosvg_palette_func_t palette_func,void *closure)

{
  render_context_t context;
  render_state_t local_a0;
  render_context_t local_58;
  
  local_a0.parent = (render_state *)0x0;
  local_a0.mode = render_mode_painting;
  local_a0.opacity = 1.0;
  local_a0.extents.x = 0.0;
  local_a0.extents.y = 0.0;
  local_a0.extents.w = -1.0;
  local_a0.extents.h = -1.0;
  local_a0.view_width = document->width;
  local_a0.view_height = document->height;
  plutovg_canvas_get_matrix(canvas,&local_a0.matrix);
  if (id == (char *)0x0) {
    local_a0.element = document->root_element;
  }
  else {
    local_58.document = (plutosvg_document_t *)id;
    local_58.canvas = (plutovg_canvas_t *)strlen(id);
    local_a0.element = find_element(document,(string_t *)&local_58);
    if (local_a0.element == (element_t *)0x0) {
      return false;
    }
  }
  local_58.document = document;
  local_58.canvas = canvas;
  local_58.current_color = current_color;
  local_58.palette_func = palette_func;
  local_58.closure = closure;
  render_element(local_a0.element,&local_58,&local_a0);
  return true;
}

Assistant:

bool plutosvg_document_render(const plutosvg_document_t* document, const char* id, plutovg_canvas_t* canvas, const plutovg_color_t* current_color, plutosvg_palette_func_t palette_func, void* closure)
{
    render_state_t state;
    state.parent = NULL;
    state.mode = render_mode_painting;
    state.opacity = 1.f;
    state.extents = INVALID_RECT;
    state.view_width = document->width;
    state.view_height = document->height;
    plutovg_canvas_get_matrix(canvas, &state.matrix);
    if(id == NULL) {
        state.element = document->root_element;
    } else {
        const string_t name = {id, strlen(id)};
        const element_t* element = find_element(document, &name);
        if(element == NULL)
            return false;
        state.element = element;
    }

    render_context_t context = {document, canvas, current_color, palette_func, closure};
    render_element(state.element, &context, &state);
    return true;
}